

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O1

void aom_get_var_sse_sum_16x16_dual_c
               (uint8_t *src_ptr,int source_stride,uint8_t *ref_ptr,int ref_stride,
               uint32_t *sse16x16,uint *tot_sse,int *tot_sum,uint32_t *var16x16)

{
  undefined4 uVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  undefined1 auVar12 [12];
  unkbyte10 Var13;
  int iVar14;
  long lVar15;
  uint8_t *puVar16;
  int i;
  int iVar17;
  uint8_t *puVar18;
  long lVar19;
  bool bVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  uint32_t uVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  short sVar30;
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  int local_30 [2];
  int sum16x16 [2];
  
  local_30[0] = 0;
  local_30[1] = 0;
  lVar15 = 0;
  do {
    puVar18 = src_ptr + lVar15 * 0x10;
    puVar16 = ref_ptr + lVar15 * 0x10;
    uVar25 = 0;
    iVar21 = 0;
    iVar17 = 0;
    do {
      iVar26 = 0;
      iVar27 = 0;
      iVar28 = 0;
      iVar22 = 0;
      iVar23 = 0;
      iVar24 = 0;
      lVar19 = 0;
      do {
        uVar1 = *(undefined4 *)(puVar18 + lVar19);
        uVar8 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
        auVar2._8_4_ = 0;
        auVar2._0_8_ = uVar8;
        auVar2[0xc] = (char)((uint)uVar1 >> 0x18);
        auVar3[8] = (char)((uint)uVar1 >> 0x10);
        auVar3._0_8_ = uVar8;
        auVar3[9] = 0;
        auVar3._10_3_ = auVar2._10_3_;
        auVar10._5_8_ = 0;
        auVar10._0_5_ = auVar3._8_5_;
        auVar4[4] = (char)((uint)uVar1 >> 8);
        auVar4._0_4_ = (int)uVar8;
        auVar4[5] = 0;
        auVar4._6_7_ = SUB137(auVar10 << 0x40,6);
        uVar1 = *(undefined4 *)(puVar16 + lVar19);
        uVar9 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
        auVar5._8_4_ = 0;
        auVar5._0_8_ = uVar9;
        auVar5[0xc] = (char)((uint)uVar1 >> 0x18);
        auVar6[8] = (char)((uint)uVar1 >> 0x10);
        auVar6._0_8_ = uVar9;
        auVar6[9] = 0;
        auVar6._10_3_ = auVar5._10_3_;
        auVar11._5_8_ = 0;
        auVar11._0_5_ = auVar6._8_5_;
        auVar7[4] = (char)((uint)uVar1 >> 8);
        auVar7._0_4_ = (int)uVar9;
        auVar7[5] = 0;
        auVar7._6_7_ = SUB137(auVar11 << 0x40,6);
        auVar29._0_4_ = (int)uVar8 - (int)uVar9;
        auVar29._4_4_ = auVar4._4_4_ - auVar7._4_4_;
        auVar29._8_4_ = auVar3._8_4_ - auVar6._8_4_;
        auVar29._12_4_ = (uint)(uint3)(auVar2._10_3_ >> 0x10) - (uint)(uint3)(auVar5._10_3_ >> 0x10)
        ;
        iVar21 = iVar21 + auVar29._0_4_;
        iVar22 = iVar22 + auVar29._4_4_;
        iVar23 = iVar23 + auVar29._8_4_;
        iVar24 = iVar24 + auVar29._12_4_;
        auVar29 = packssdw(auVar29,auVar29);
        auVar31 = pmulhw(auVar29,auVar29);
        sVar30 = auVar29._6_2_ * auVar29._6_2_;
        iVar14 = CONCAT22(auVar31._6_2_,sVar30);
        Var13 = CONCAT64(CONCAT42(iVar14,auVar31._4_2_),
                         CONCAT22(auVar29._4_2_ * auVar29._4_2_,sVar30));
        auVar12._4_8_ = (long)((unkuint10)Var13 >> 0x10);
        auVar12._2_2_ = auVar31._2_2_;
        auVar12._0_2_ = auVar29._2_2_ * auVar29._2_2_;
        uVar25 = uVar25 + CONCAT22(auVar31._0_2_,auVar29._0_2_ * auVar29._0_2_);
        iVar26 = iVar26 + auVar12._0_4_;
        iVar27 = iVar27 + (int)((unkuint10)Var13 >> 0x10);
        iVar28 = iVar28 + iVar14;
        lVar19 = lVar19 + 4;
      } while (lVar19 != 0x10);
      uVar25 = iVar28 + iVar26 + iVar27 + uVar25;
      iVar21 = iVar24 + iVar22 + iVar23 + iVar21;
      puVar18 = puVar18 + source_stride;
      puVar16 = puVar16 + ref_stride;
      iVar17 = iVar17 + 1;
    } while (iVar17 != 0x10);
    local_30[lVar15] = iVar21;
    sse16x16[lVar15] = uVar25;
    bVar20 = lVar15 == 0;
    lVar15 = lVar15 + 1;
  } while (bVar20);
  *tot_sse = *tot_sse + sse16x16[1] + *sse16x16;
  *tot_sum = *tot_sum + local_30[1] + local_30[0];
  lVar15 = 0;
  do {
    var16x16[lVar15] =
         sse16x16[lVar15] - (int)((ulong)((long)local_30[lVar15] * (long)local_30[lVar15]) >> 8);
    lVar15 = lVar15 + 1;
  } while (lVar15 == 1);
  return;
}

Assistant:

void aom_get_var_sse_sum_16x16_dual_c(const uint8_t *src_ptr, int source_stride,
                                      const uint8_t *ref_ptr, int ref_stride,
                                      uint32_t *sse16x16, unsigned int *tot_sse,
                                      int *tot_sum, uint32_t *var16x16) {
  int sum16x16[2] = { 0 };
  // Loop over two consecutive 16x16 blocks and process as one 16x32 block.
  for (int k = 0; k < 2; k++) {
    variance(src_ptr + (k * 16), source_stride, ref_ptr + (k * 16), ref_stride,
             16, 16, &sse16x16[k], &sum16x16[k]);
  }

  // Calculate variance at 16x16 level and total sse, sum of 16x32 block.
  *tot_sse += sse16x16[0] + sse16x16[1];
  *tot_sum += sum16x16[0] + sum16x16[1];
  for (int i = 0; i < 2; i++)
    var16x16[i] =
        sse16x16[i] - (uint32_t)(((int64_t)sum16x16[i] * sum16x16[i]) >> 8);
}